

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdefaultrt.hpp
# Opt level: O3

int __thiscall
soplex::
SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeave(SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,
             number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *param_2,bool param_3)

{
  bool bVar1;
  uint uVar2;
  int32_t iVar3;
  long lVar4;
  undefined8 uVar5;
  int iVar6;
  fpclass_type fVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  uint *puVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  undefined4 *puVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  cpp_dec_float<200U,_int,_void> *pcVar19;
  undefined4 *puVar20;
  long lVar21;
  long in_FS_OFFSET;
  byte bVar22;
  Real a;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  uint local_304;
  undefined1 local_2e8 [32];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [13];
  undefined3 uStack_27b;
  int iStack_278;
  bool bStack_274;
  undefined8 local_270;
  cpp_dec_float<200U,_int,_void> *local_268;
  long local_260;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [13];
  undefined3 uStack_1eb;
  int iStack_1e8;
  bool bStack_1e4;
  undefined8 local_1e0;
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [13];
  undefined3 uStack_16b;
  int iStack_168;
  bool bStack_164;
  undefined8 local_160;
  undefined1 local_158 [32];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [13];
  undefined3 uStack_eb;
  int iStack_e8;
  bool bStack_e4;
  undefined8 local_e0;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [13];
  undefined3 uStack_4b;
  int iStack_48;
  bool bStack_44;
  undefined8 local_40;
  
  bVar22 = 0;
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])();
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var,iVar6) + 0xfe8) + 0x98));
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar12 = **(long **)(CONCAT44(extraout_var_00,iVar6) + 0xfe8);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar11 = *(long *)(*(long *)(CONCAT44(extraout_var_01,iVar6) + 0xfe8) + 0xb8);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar10 = *(long *)(CONCAT44(extraout_var_02,iVar6) + 0xfe8);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar4 = *(long *)(CONCAT44(extraout_var_03,iVar6) + 0xfb0);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  local_260 = *(long *)(CONCAT44(extraout_var_04,iVar6) + 0xfc8);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  a = Tolerances::epsilon(*(Tolerances **)(CONCAT44(extraout_var_05,iVar6) + 0x228));
  local_40 = 0x1c00000000;
  local_b8._0_16_ = (undefined1  [16])0x0;
  local_b8._16_16_ = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_58 = SUB1613((undefined1  [16])0x0,0);
  uStack_4b = 0;
  iStack_48 = 0;
  bStack_44 = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)local_b8,a);
  local_e0._0_4_ = cpp_dec_float_finite;
  local_e0._4_4_ = 0x1c;
  local_158._0_16_ = (undefined1  [16])0x0;
  local_158._16_16_ = (undefined1  [16])0x0;
  local_138 = (undefined1  [16])0x0;
  local_128 = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_f8 = SUB1613((undefined1  [16])0x0,0);
  uStack_eb = 0;
  iStack_e8 = 0;
  bStack_e4 = false;
  if ((val->m_backend).fpclass != cpp_dec_float_NaN) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<200U,_int,_void> *)local_2e8,0,(type *)0x0);
    iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&val->m_backend,(cpp_dec_float<200U,_int,_void> *)local_2e8);
    if (0 < iVar6) {
      if (*(int *)(lVar10 + 0xa0) < 1) {
        return -1;
      }
      local_268 = &(this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).delta.m_backend;
      local_c8 = *(double *)(in_FS_OFFSET + -8);
      uStack_c0 = 0;
      local_d8 = -*(double *)(in_FS_OFFSET + -8);
      uStack_d0 = 0x8000000000000000;
      local_304 = 0xffffffff;
      lVar21 = 0;
      do {
        uVar2 = *(uint *)(*(long *)(lVar10 + 0xa8) + lVar21 * 4);
        lVar13 = (long)(int)uVar2 * 0x80;
        puVar15 = (uint *)(lVar11 + lVar13);
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_158;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pcVar16->data)._M_elems[0] = *puVar15;
          puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar22 * -8 + 4);
        }
        iStack_e8 = *(int *)(lVar11 + 0x70 + lVar13);
        bStack_e4 = (bool)*(undefined1 *)(lVar11 + 0x74 + lVar13);
        uVar5 = *(undefined8 *)(lVar11 + 0x78 + lVar13);
        local_e0._0_4_ = (fpclass_type)uVar5;
        local_e0._4_4_ = SUB84(uVar5,4);
        fVar7 = (fpclass_type)local_40;
        if ((fpclass_type)local_40 == cpp_dec_float_NaN || (fpclass_type)uVar5 == cpp_dec_float_NaN)
        {
LAB_005ac1ab:
          puVar17 = (undefined4 *)local_b8;
          puVar20 = (undefined4 *)local_2e8;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar20 = *puVar17;
            puVar17 = puVar17 + (ulong)bVar22 * -2 + 1;
            puVar20 = puVar20 + (ulong)bVar22 * -2 + 1;
          }
          iStack_278 = iStack_48;
          bStack_274 = bStack_44;
          local_270 = CONCAT44(local_40._4_4_,fVar7);
          if (local_2e8._0_4_ != 0 || fVar7 != cpp_dec_float_finite) {
            bStack_274 = (bool)(bStack_44 ^ 1);
          }
          if (((fVar7 != cpp_dec_float_NaN) && ((fpclass_type)local_e0 != cpp_dec_float_NaN)) &&
             (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_158,
                                 (cpp_dec_float<200U,_int,_void> *)local_2e8), iVar6 < 0)) {
            ::soplex::infinity::__tls_init();
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)(local_260 + lVar13);
            local_270 = 0x1c00000000;
            local_2e8._0_16_ = (undefined1  [16])0x0;
            local_2e8._16_16_ = (undefined1  [16])0x0;
            local_2c8 = (undefined1  [16])0x0;
            local_2b8 = (undefined1  [16])0x0;
            local_2a8 = (undefined1  [16])0x0;
            local_298 = (undefined1  [16])0x0;
            local_288 = SUB1613((undefined1  [16])0x0,0);
            uStack_27b = 0;
            iStack_278 = 0;
            bStack_274 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_2e8,local_d8);
            if (((pcVar16->fpclass != cpp_dec_float_NaN) &&
                ((fpclass_type)local_270 != cpp_dec_float_NaN)) &&
               (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (pcVar16,(cpp_dec_float<200U,_int,_void> *)local_2e8), 0 < iVar6))
            {
              local_160._0_4_ = cpp_dec_float_finite;
              local_160._4_4_ = 0x1c;
              local_1d8._0_16_ = (undefined1  [16])0x0;
              local_1d8._16_16_ = (undefined1  [16])0x0;
              local_1b8 = (undefined1  [16])0x0;
              local_1a8 = (undefined1  [16])0x0;
              local_198 = (undefined1  [16])0x0;
              local_188 = (undefined1  [16])0x0;
              local_178 = SUB1613((undefined1  [16])0x0,0);
              uStack_16b = 0;
              iStack_168 = 0;
              bStack_164 = false;
              if ((cpp_dec_float<200U,_int,_void> *)local_1d8 ==
                  (cpp_dec_float<200U,_int,_void> *)(lVar13 + lVar12)) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_1d8,pcVar16);
                if (local_1d8._0_4_ != 0 || (fpclass_type)local_160 != cpp_dec_float_finite) {
                  bStack_164 = (bool)(bStack_164 ^ 1);
                }
              }
              else {
                if ((cpp_dec_float<200U,_int,_void> *)local_1d8 != pcVar16) {
                  pcVar14 = pcVar16;
                  pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_1d8;
                  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                    (pcVar19->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
                    pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar14 + (ulong)bVar22 * -8 + 4);
                    pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar19 + (ulong)bVar22 * -8 + 4);
                  }
                  iStack_168 = pcVar16->exp;
                  bStack_164 = pcVar16->neg;
                  local_160._0_4_ = pcVar16->fpclass;
                  local_160._4_4_ = pcVar16->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_1d8,
                           (cpp_dec_float<200U,_int,_void> *)(lVar13 + lVar12));
              }
              local_1e0._0_4_ = cpp_dec_float_finite;
              local_1e0._4_4_ = 0x1c;
              local_258 = (undefined1  [16])0x0;
              local_248 = (undefined1  [16])0x0;
              local_238 = (undefined1  [16])0x0;
              local_228 = (undefined1  [16])0x0;
              local_218 = (undefined1  [16])0x0;
              local_208 = (undefined1  [16])0x0;
              local_1f8 = SUB1613((undefined1  [16])0x0,0);
              uStack_1eb = 0;
              iStack_1e8 = 0;
              bStack_1e4 = false;
              if ((cpp_dec_float<200U,_int,_void> *)local_258 == local_268) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_258,
                           (cpp_dec_float<200U,_int,_void> *)local_1d8);
                if (local_258._0_4_ != 0 || (fpclass_type)local_1e0 != cpp_dec_float_finite) {
                  bStack_1e4 = (bool)(bStack_1e4 ^ 1);
                }
              }
              else {
                puVar15 = (uint *)local_1d8;
                pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_258;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (pcVar16->data)._M_elems[0] = *puVar15;
                  puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
                  pcVar16 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar16 + (ulong)bVar22 * -8 + 4);
                }
                iStack_1e8 = iStack_168;
                bStack_1e4 = bStack_164;
                local_1e0._0_4_ = (fpclass_type)local_160;
                local_1e0._4_4_ = local_160._4_4_;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_258,local_268);
              }
              goto LAB_005ac5e9;
            }
          }
        }
        else {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_158,
                             (cpp_dec_float<200U,_int,_void> *)local_b8);
          if (iVar6 < 1) {
            fVar7 = (fpclass_type)local_40;
            goto LAB_005ac1ab;
          }
          ::soplex::infinity::__tls_init();
          pcVar16 = (cpp_dec_float<200U,_int,_void> *)(lVar4 + lVar13);
          local_270 = 0x1c00000000;
          local_2e8._0_16_ = (undefined1  [16])0x0;
          local_2e8._16_16_ = (undefined1  [16])0x0;
          local_2c8 = (undefined1  [16])0x0;
          local_2b8 = (undefined1  [16])0x0;
          local_2a8 = (undefined1  [16])0x0;
          local_298 = (undefined1  [16])0x0;
          local_288 = SUB1613((undefined1  [16])0x0,0);
          uStack_27b = 0;
          iStack_278 = 0;
          bStack_274 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_2e8,local_c8);
          if (((pcVar16->fpclass != cpp_dec_float_NaN) &&
              ((fpclass_type)local_270 != cpp_dec_float_NaN)) &&
             (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (pcVar16,(cpp_dec_float<200U,_int,_void> *)local_2e8), iVar6 < 0)) {
            local_160._0_4_ = cpp_dec_float_finite;
            local_160._4_4_ = 0x1c;
            local_1d8._0_16_ = (undefined1  [16])0x0;
            local_1d8._16_16_ = (undefined1  [16])0x0;
            local_1b8 = (undefined1  [16])0x0;
            local_1a8 = (undefined1  [16])0x0;
            local_198 = (undefined1  [16])0x0;
            local_188 = (undefined1  [16])0x0;
            local_178 = SUB1613((undefined1  [16])0x0,0);
            uStack_16b = 0;
            iStack_168 = 0;
            bStack_164 = false;
            if ((cpp_dec_float<200U,_int,_void> *)local_1d8 ==
                (cpp_dec_float<200U,_int,_void> *)(lVar13 + lVar12)) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_1d8,pcVar16);
              if (local_1d8._0_4_ != 0 || (fpclass_type)local_160 != cpp_dec_float_finite) {
                bStack_164 = (bool)(bStack_164 ^ 1);
              }
            }
            else {
              if ((cpp_dec_float<200U,_int,_void> *)local_1d8 != pcVar16) {
                pcVar14 = pcVar16;
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_1d8;
                for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                  (pcVar19->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
                  pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar14 + (ulong)bVar22 * -8 + 4);
                  pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar19 + (ulong)bVar22 * -8 + 4);
                }
                iStack_168 = pcVar16->exp;
                bStack_164 = pcVar16->neg;
                local_160._0_4_ = pcVar16->fpclass;
                local_160._4_4_ = pcVar16->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_1d8,
                         (cpp_dec_float<200U,_int,_void> *)(lVar13 + lVar12));
            }
            local_1e0._0_4_ = cpp_dec_float_finite;
            local_1e0._4_4_ = 0x1c;
            local_258 = (undefined1  [16])0x0;
            local_248 = (undefined1  [16])0x0;
            local_238 = (undefined1  [16])0x0;
            local_228 = (undefined1  [16])0x0;
            local_218 = (undefined1  [16])0x0;
            local_208 = (undefined1  [16])0x0;
            local_1f8 = SUB1613((undefined1  [16])0x0,0);
            uStack_1eb = 0;
            iStack_1e8 = 0;
            bStack_1e4 = false;
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_1d8;
            if ((cpp_dec_float<200U,_int,_void> *)local_258 != local_268) {
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_258;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pcVar14->data)._M_elems[0] = (pcVar16->data)._M_elems[0];
                pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar22 * -8 + 4)
                ;
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar22 * -8 + 4)
                ;
              }
              iStack_1e8 = iStack_168;
              bStack_1e4 = bStack_164;
              local_1e0._0_4_ = (fpclass_type)local_160;
              local_1e0._4_4_ = local_160._4_4_;
              pcVar16 = local_268;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_258,pcVar16);
LAB_005ac5e9:
            local_270 = 0x1c00000000;
            local_2e8._0_16_ = (undefined1  [16])0x0;
            local_2e8._16_16_ = (undefined1  [16])0x0;
            local_2c8 = (undefined1  [16])0x0;
            local_2b8 = (undefined1  [16])0x0;
            local_2a8 = (undefined1  [16])0x0;
            local_298 = (undefined1  [16])0x0;
            local_288 = SUB1613((undefined1  [16])0x0,0);
            uStack_27b = 0;
            iStack_278 = 0;
            bStack_274 = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      ((cpp_dec_float<200U,_int,_void> *)local_2e8,
                       (cpp_dec_float<200U,_int,_void> *)local_258,
                       (cpp_dec_float<200U,_int,_void> *)local_158);
            if ((((fpclass_type)local_270 != cpp_dec_float_NaN) &&
                ((val->m_backend).fpclass != cpp_dec_float_NaN)) &&
               (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  ((cpp_dec_float<200U,_int,_void> *)local_2e8,&val->m_backend),
               iVar6 < 0)) {
              puVar15 = (uint *)local_2e8;
              pnVar18 = val;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pnVar18->m_backend).data._M_elems[0] = *puVar15;
                puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
                pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
              }
              (val->m_backend).exp = iStack_278;
              (val->m_backend).neg = bStack_274;
              (val->m_backend).fpclass = (fpclass_type)local_270;
              (val->m_backend).prec_elem = local_270._4_4_;
              local_304 = uVar2;
            }
          }
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 < *(int *)(lVar10 + 0xa0));
      if ((int)local_304 < 0) {
        return local_304;
      }
      lVar21 = (ulong)local_304 * 0x80;
      puVar17 = (undefined4 *)(lVar11 + lVar21);
      puVar20 = (undefined4 *)local_158;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar20 = *puVar17;
        puVar17 = puVar17 + (ulong)bVar22 * -2 + 1;
        puVar20 = puVar20 + (ulong)bVar22 * -2 + 1;
      }
      iStack_e8 = *(int *)(lVar11 + 0x70 + lVar21);
      bStack_e4 = (bool)*(undefined1 *)(lVar11 + 0x74 + lVar21);
      uVar5 = *(undefined8 *)(lVar11 + 0x78 + lVar21);
      local_e0._0_4_ = (fpclass_type)uVar5;
      local_e0._4_4_ = SUB84(uVar5,4);
      lVar11 = local_260;
      if ((((fpclass_type)uVar5 != cpp_dec_float_NaN) &&
          ((fpclass_type)local_40 != cpp_dec_float_NaN)) &&
         (((iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_158,
                               (cpp_dec_float<200U,_int,_void> *)local_b8), lVar11 = local_260,
           0 < iVar6 &&
           ((*(int *)(lVar12 + 0x78 + lVar21) != 2 && (*(int *)(lVar4 + 0x78 + lVar21) != 2)))) &&
          (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)(lVar12 + lVar21),
                              (cpp_dec_float<200U,_int,_void> *)(lVar4 + lVar21)), -1 < iVar6))))
      goto LAB_005ad27f;
      puVar17 = (undefined4 *)local_b8;
      puVar20 = (undefined4 *)local_2e8;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar20 = *puVar17;
        puVar17 = puVar17 + (ulong)bVar22 * -2 + 1;
        puVar20 = puVar20 + (ulong)bVar22 * -2 + 1;
      }
      iStack_278 = iStack_48;
      bStack_274 = bStack_44;
      local_270 = local_40;
      if (local_2e8._0_4_ != 0 || (int)local_40 != 0) {
        bStack_274 = (bool)(bStack_44 ^ 1);
      }
      if ((((((int)local_40 != 2) && ((fpclass_type)local_e0 != cpp_dec_float_NaN)) &&
           (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_158,
                               (cpp_dec_float<200U,_int,_void> *)local_2e8), iVar6 < 0)) &&
          ((*(int *)(lVar12 + 0x78 + lVar21) != 2 && (*(int *)(lVar11 + 0x78 + lVar21) != 2)))) &&
         (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)(lVar12 + lVar21),
                             (cpp_dec_float<200U,_int,_void> *)(lVar11 + lVar21)), iVar6 < 1))
      goto LAB_005ad27f;
      if ((((fpclass_type)local_e0 != cpp_dec_float_NaN) &&
          ((fpclass_type)local_40 != cpp_dec_float_NaN)) &&
         (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_158,
                             (cpp_dec_float<200U,_int,_void> *)local_b8), 0 < iVar6)) {
        lVar11 = lVar4;
      }
      goto LAB_005ad0ab;
    }
  }
  if (*(int *)(lVar10 + 0xa0) < 1) {
    return -1;
  }
  local_268 = &(this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).delta.m_backend;
  local_d8 = *(double *)(in_FS_OFFSET + -8);
  uStack_d0 = 0;
  local_c8 = -*(double *)(in_FS_OFFSET + -8);
  uStack_c0 = 0x8000000000000000;
  local_304 = 0xffffffff;
  lVar21 = 0;
  do {
    uVar2 = *(uint *)(*(long *)(lVar10 + 0xa8) + lVar21 * 4);
    lVar13 = (long)(int)uVar2 * 0x80;
    puVar15 = (uint *)(lVar11 + lVar13);
    pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_158;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pcVar16->data)._M_elems[0] = *puVar15;
      puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
      pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar22 * -8 + 4);
    }
    iStack_e8 = *(int *)(lVar11 + 0x70 + lVar13);
    bStack_e4 = (bool)*(undefined1 *)(lVar11 + 0x74 + lVar13);
    uVar5 = *(undefined8 *)(lVar11 + 0x78 + lVar13);
    local_e0._0_4_ = (fpclass_type)uVar5;
    local_e0._4_4_ = SUB84(uVar5,4);
    puVar17 = (undefined4 *)local_b8;
    puVar20 = (undefined4 *)local_2e8;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      *puVar20 = *puVar17;
      puVar17 = puVar17 + (ulong)bVar22 * -2 + 1;
      puVar20 = puVar20 + (ulong)bVar22 * -2 + 1;
    }
    iStack_278 = iStack_48;
    bStack_274 = bStack_44;
    local_270 = local_40;
    if (local_2e8._0_4_ != 0 || (int)local_40 != 0) {
      bStack_274 = (bool)(bStack_44 ^ 1);
    }
    uVar8 = local_40;
    fVar7 = (fpclass_type)uVar5;
    if ((fpclass_type)uVar5 == cpp_dec_float_NaN || (int)local_40 == 2) {
LAB_005ac7e0:
      if (((fVar7 != cpp_dec_float_NaN) && ((int)uVar8 != 2)) &&
         (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_158,
                             (cpp_dec_float<200U,_int,_void> *)local_b8), 0 < iVar6)) {
        ::soplex::infinity::__tls_init();
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)(local_260 + lVar13);
        local_270._0_4_ = cpp_dec_float_finite;
        local_270._4_4_ = 0x1c;
        local_2e8._0_16_ = (undefined1  [16])0x0;
        local_2e8._16_16_ = (undefined1  [16])0x0;
        local_2c8 = (undefined1  [16])0x0;
        local_2b8 = (undefined1  [16])0x0;
        local_2a8 = (undefined1  [16])0x0;
        local_298 = (undefined1  [16])0x0;
        local_288 = SUB1613((undefined1  [16])0x0,0);
        uStack_27b = 0;
        iStack_278 = 0;
        bStack_274 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_2e8,local_c8);
        if (((pcVar16->fpclass != cpp_dec_float_NaN) &&
            ((fpclass_type)local_270 != cpp_dec_float_NaN)) &&
           (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (pcVar16,(cpp_dec_float<200U,_int,_void> *)local_2e8), 0 < iVar6)) {
          local_160._0_4_ = cpp_dec_float_finite;
          local_160._4_4_ = 0x1c;
          local_1d8._0_16_ = (undefined1  [16])0x0;
          local_1d8._16_16_ = (undefined1  [16])0x0;
          local_1b8 = (undefined1  [16])0x0;
          local_1a8 = (undefined1  [16])0x0;
          local_198 = (undefined1  [16])0x0;
          local_188 = (undefined1  [16])0x0;
          local_178 = SUB1613((undefined1  [16])0x0,0);
          uStack_16b = 0;
          iStack_168 = 0;
          bStack_164 = false;
          if ((cpp_dec_float<200U,_int,_void> *)local_1d8 ==
              (cpp_dec_float<200U,_int,_void> *)(lVar13 + lVar12)) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_1d8,pcVar16);
            if (local_1d8._0_4_ != 0 || (fpclass_type)local_160 != cpp_dec_float_finite) {
              bStack_164 = (bool)(bStack_164 ^ 1);
            }
          }
          else {
            if ((cpp_dec_float<200U,_int,_void> *)local_1d8 != pcVar16) {
              pcVar14 = pcVar16;
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_1d8;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pcVar19->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar22 * -8 + 4)
                ;
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar22 * -8 + 4)
                ;
              }
              iStack_168 = pcVar16->exp;
              bStack_164 = pcVar16->neg;
              local_160._0_4_ = pcVar16->fpclass;
              local_160._4_4_ = pcVar16->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_1d8,
                       (cpp_dec_float<200U,_int,_void> *)(lVar13 + lVar12));
          }
          local_1e0._0_4_ = cpp_dec_float_finite;
          local_1e0._4_4_ = 0x1c;
          local_258 = (undefined1  [16])0x0;
          local_248 = (undefined1  [16])0x0;
          local_238 = (undefined1  [16])0x0;
          local_228 = (undefined1  [16])0x0;
          local_218 = (undefined1  [16])0x0;
          local_208 = (undefined1  [16])0x0;
          local_1f8 = SUB1613((undefined1  [16])0x0,0);
          uStack_1eb = 0;
          iStack_1e8 = 0;
          bStack_1e4 = false;
          if ((cpp_dec_float<200U,_int,_void> *)local_258 == local_268) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_258,
                       (cpp_dec_float<200U,_int,_void> *)local_1d8);
            if (local_258._0_4_ != 0 || (fpclass_type)local_1e0 != cpp_dec_float_finite) {
              bStack_1e4 = (bool)(bStack_1e4 ^ 1);
            }
          }
          else {
            puVar15 = (uint *)local_1d8;
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_258;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pcVar16->data)._M_elems[0] = *puVar15;
              puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar22 * -8 + 4);
            }
            iStack_1e8 = iStack_168;
            bStack_1e4 = bStack_164;
            local_1e0._0_4_ = (fpclass_type)local_160;
            local_1e0._4_4_ = local_160._4_4_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_258,local_268);
          }
          goto LAB_005acd22;
        }
      }
    }
    else {
      iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        ((cpp_dec_float<200U,_int,_void> *)local_158,
                         (cpp_dec_float<200U,_int,_void> *)local_2e8);
      if (-1 < iVar6) {
        uVar8 = local_40 & 0xffffffff;
        fVar7 = (fpclass_type)local_e0;
        goto LAB_005ac7e0;
      }
      ::soplex::infinity::__tls_init();
      pcVar16 = (cpp_dec_float<200U,_int,_void> *)(lVar4 + lVar13);
      local_270._0_4_ = cpp_dec_float_finite;
      local_270._4_4_ = 0x1c;
      local_2e8._0_16_ = (undefined1  [16])0x0;
      local_2e8._16_16_ = (undefined1  [16])0x0;
      local_2c8 = (undefined1  [16])0x0;
      local_2b8 = (undefined1  [16])0x0;
      local_2a8 = (undefined1  [16])0x0;
      local_298 = (undefined1  [16])0x0;
      local_288 = SUB1613((undefined1  [16])0x0,0);
      uStack_27b = 0;
      iStack_278 = 0;
      bStack_274 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_2e8,local_d8);
      if (((pcVar16->fpclass != cpp_dec_float_NaN) && ((fpclass_type)local_270 != cpp_dec_float_NaN)
          ) && (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (pcVar16,(cpp_dec_float<200U,_int,_void> *)local_2e8), iVar6 < 0))
      {
        local_160._0_4_ = cpp_dec_float_finite;
        local_160._4_4_ = 0x1c;
        local_1d8._0_16_ = (undefined1  [16])0x0;
        local_1d8._16_16_ = (undefined1  [16])0x0;
        local_1b8 = (undefined1  [16])0x0;
        local_1a8 = (undefined1  [16])0x0;
        local_198 = (undefined1  [16])0x0;
        local_188 = (undefined1  [16])0x0;
        local_178 = SUB1613((undefined1  [16])0x0,0);
        uStack_16b = 0;
        iStack_168 = 0;
        bStack_164 = false;
        if ((cpp_dec_float<200U,_int,_void> *)local_1d8 ==
            (cpp_dec_float<200U,_int,_void> *)(lVar13 + lVar12)) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_1d8,pcVar16);
          if (local_1d8._0_4_ != 0 || (fpclass_type)local_160 != cpp_dec_float_finite) {
            bStack_164 = (bool)(bStack_164 ^ 1);
          }
        }
        else {
          if ((cpp_dec_float<200U,_int,_void> *)local_1d8 != pcVar16) {
            pcVar14 = pcVar16;
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_1d8;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pcVar19->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar22 * -8 + 4);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar22 * -8 + 4);
            }
            iStack_168 = pcVar16->exp;
            bStack_164 = pcVar16->neg;
            local_160._0_4_ = pcVar16->fpclass;
            local_160._4_4_ = pcVar16->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_1d8,
                     (cpp_dec_float<200U,_int,_void> *)(lVar13 + lVar12));
        }
        local_1e0._0_4_ = cpp_dec_float_finite;
        local_1e0._4_4_ = 0x1c;
        local_258 = (undefined1  [16])0x0;
        local_248 = (undefined1  [16])0x0;
        local_238 = (undefined1  [16])0x0;
        local_228 = (undefined1  [16])0x0;
        local_218 = (undefined1  [16])0x0;
        local_208 = (undefined1  [16])0x0;
        local_1f8 = SUB1613((undefined1  [16])0x0,0);
        uStack_1eb = 0;
        iStack_1e8 = 0;
        bStack_1e4 = false;
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_1d8;
        if ((cpp_dec_float<200U,_int,_void> *)local_258 != local_268) {
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_258;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar14->data)._M_elems[0] = (pcVar16->data)._M_elems[0];
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar22 * -8 + 4);
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar22 * -8 + 4);
          }
          iStack_1e8 = iStack_168;
          bStack_1e4 = bStack_164;
          local_1e0._0_4_ = (fpclass_type)local_160;
          local_1e0._4_4_ = local_160._4_4_;
          pcVar16 = local_268;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  ((cpp_dec_float<200U,_int,_void> *)local_258,pcVar16);
LAB_005acd22:
        local_270._0_4_ = cpp_dec_float_finite;
        local_270._4_4_ = 0x1c;
        local_2e8._0_16_ = (undefined1  [16])0x0;
        local_2e8._16_16_ = (undefined1  [16])0x0;
        local_2c8 = (undefined1  [16])0x0;
        local_2b8 = (undefined1  [16])0x0;
        local_2a8 = (undefined1  [16])0x0;
        local_298 = (undefined1  [16])0x0;
        local_288 = SUB1613((undefined1  [16])0x0,0);
        uStack_27b = 0;
        iStack_278 = 0;
        bStack_274 = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_2e8,
                   (cpp_dec_float<200U,_int,_void> *)local_258,
                   (cpp_dec_float<200U,_int,_void> *)local_158);
        if ((((fpclass_type)local_270 != cpp_dec_float_NaN) &&
            ((val->m_backend).fpclass != cpp_dec_float_NaN)) &&
           (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_2e8,&val->m_backend),
           0 < iVar6)) {
          puVar15 = (uint *)local_2e8;
          pnVar18 = val;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pnVar18->m_backend).data._M_elems[0] = *puVar15;
            puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
            pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
          }
          (val->m_backend).exp = iStack_278;
          (val->m_backend).neg = bStack_274;
          (val->m_backend).fpclass = (fpclass_type)local_270;
          (val->m_backend).prec_elem = local_270._4_4_;
          local_304 = uVar2;
        }
      }
    }
    lVar21 = lVar21 + 1;
  } while (lVar21 < *(int *)(lVar10 + 0xa0));
  if ((int)local_304 < 0) {
    return local_304;
  }
  lVar21 = (ulong)local_304 * 0x80;
  puVar17 = (undefined4 *)(lVar11 + lVar21);
  puVar20 = (undefined4 *)local_158;
  for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar20 = *puVar17;
    puVar17 = puVar17 + (ulong)bVar22 * -2 + 1;
    puVar20 = puVar20 + (ulong)bVar22 * -2 + 1;
  }
  iStack_e8 = *(int *)(lVar11 + 0x70 + lVar21);
  bStack_e4 = (bool)*(undefined1 *)(lVar11 + 0x74 + lVar21);
  uVar5 = *(undefined8 *)(lVar11 + 0x78 + lVar21);
  local_e0._0_4_ = (fpclass_type)uVar5;
  local_e0._4_4_ = SUB84(uVar5,4);
  puVar17 = (undefined4 *)local_b8;
  puVar20 = (undefined4 *)local_2e8;
  for (lVar10 = 0x1c; lVar11 = local_260, lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar20 = *puVar17;
    puVar17 = puVar17 + (ulong)bVar22 * -2 + 1;
    puVar20 = puVar20 + (ulong)bVar22 * -2 + 1;
  }
  iStack_278 = iStack_48;
  bStack_274 = bStack_44;
  local_270 = local_40;
  if (local_2e8._0_4_ != 0 || (int)local_40 != 0) {
    bStack_274 = (bool)(bStack_44 ^ 1);
  }
  if (((((int)local_40 != 2 && (fpclass_type)uVar5 != cpp_dec_float_NaN) &&
       (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_158,
                           (cpp_dec_float<200U,_int,_void> *)local_2e8), iVar6 < 0)) &&
      ((*(int *)(lVar12 + 0x78 + lVar21) != 2 &&
       ((*(int *)(lVar4 + 0x78 + lVar21) != 2 &&
        (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)(lVar12 + lVar21),
                            (cpp_dec_float<200U,_int,_void> *)(lVar4 + lVar21)), -1 < iVar6)))))) ||
     (((fpclass_type)local_e0 != cpp_dec_float_NaN &&
      (((((fpclass_type)local_40 != cpp_dec_float_NaN &&
         (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_158,
                             (cpp_dec_float<200U,_int,_void> *)local_b8), 0 < iVar6)) &&
        (*(int *)(lVar12 + 0x78 + lVar21) != 2)) &&
       ((*(int *)(lVar11 + 0x78 + lVar21) != 2 &&
        (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)(lVar12 + lVar21),
                            (cpp_dec_float<200U,_int,_void> *)(lVar11 + lVar21)), iVar6 < 1))))))))
  {
LAB_005ad27f:
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)val,0.0);
    return local_304;
  }
  if ((((fpclass_type)local_e0 != cpp_dec_float_NaN) &&
      ((fpclass_type)local_40 != cpp_dec_float_NaN)) &&
     (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        ((cpp_dec_float<200U,_int,_void> *)local_158,
                         (cpp_dec_float<200U,_int,_void> *)local_b8), iVar6 < 0)) {
    lVar11 = lVar4;
  }
LAB_005ad0ab:
  puVar15 = (uint *)(lVar11 + lVar21);
  pnVar18 = val;
  for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pnVar18->m_backend).data._M_elems[0] = *puVar15;
    puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
    pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
  }
  iVar6 = *(int *)(lVar11 + 0x70 + lVar21);
  (val->m_backend).exp = iVar6;
  bVar1 = *(bool *)(lVar11 + 0x74 + lVar21);
  (val->m_backend).neg = bVar1;
  fVar7 = *(fpclass_type *)(lVar11 + 0x78 + lVar21);
  (val->m_backend).fpclass = fVar7;
  iVar3 = *(int32_t *)(lVar11 + 0x7c + lVar21);
  (val->m_backend).prec_elem = iVar3;
  local_1e0._0_4_ = cpp_dec_float_finite;
  local_1e0._4_4_ = 0x1c;
  local_258 = (undefined1  [16])0x0;
  local_248 = (undefined1  [16])0x0;
  local_238 = (undefined1  [16])0x0;
  local_228 = (undefined1  [16])0x0;
  local_218 = (undefined1  [16])0x0;
  local_208 = (undefined1  [16])0x0;
  local_1f8 = SUB1613((undefined1  [16])0x0,0);
  uStack_1eb = 0;
  iStack_1e8 = 0;
  bStack_1e4 = false;
  if ((cpp_dec_float<200U,_int,_void> *)local_258 ==
      (cpp_dec_float<200U,_int,_void> *)(lVar12 + lVar21)) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              ((cpp_dec_float<200U,_int,_void> *)local_258,&val->m_backend);
    if (local_258._0_4_ != 0 || (fpclass_type)local_1e0 != cpp_dec_float_finite) {
      bStack_1e4 = (bool)(bStack_1e4 ^ 1);
    }
  }
  else {
    if ((cpp_dec_float<200U,_int,_void> *)local_258 != &val->m_backend) {
      pnVar18 = val;
      pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_258;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pcVar16->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar22 * -8 + 4);
      }
      local_1e0._4_4_ = iVar3;
      local_1e0._0_4_ = fVar7;
      iStack_1e8 = iVar6;
      bStack_1e4 = bVar1;
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              ((cpp_dec_float<200U,_int,_void> *)local_258,
               (cpp_dec_float<200U,_int,_void> *)(lVar12 + lVar21));
  }
  local_270._0_4_ = cpp_dec_float_finite;
  local_270._4_4_ = 0x1c;
  local_2e8._0_16_ = (undefined1  [16])0x0;
  local_2e8._16_16_ = (undefined1  [16])0x0;
  local_2c8 = (undefined1  [16])0x0;
  local_2b8 = (undefined1  [16])0x0;
  local_2a8 = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_288 = SUB1613((undefined1  [16])0x0,0);
  uStack_27b = 0;
  iStack_278 = 0;
  bStack_274 = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)local_2e8,(cpp_dec_float<200U,_int,_void> *)local_258
             ,(cpp_dec_float<200U,_int,_void> *)local_158);
  pcVar16 = (cpp_dec_float<200U,_int,_void> *)local_2e8;
  pnVar18 = val;
  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pnVar18->m_backend).data._M_elems[0] = (pcVar16->data)._M_elems[0];
    pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + (ulong)bVar22 * -8 + 4);
    pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar18 + ((ulong)bVar22 * -2 + 1) * 4);
  }
  (val->m_backend).exp = iStack_278;
  (val->m_backend).neg = bStack_274;
  (val->m_backend).fpclass = (fpclass_type)local_270;
  (val->m_backend).prec_elem = local_270._4_4_;
  return local_304;
}

Assistant:

int SPxDefaultRT<R>::selectLeave(R& val, R, bool)
{
   this->solver()->fVec().delta().setup();

   const R*   vec = this->solver()->fVec().get_const_ptr();
   const R*   upd = this->solver()->fVec().delta().values();
   const IdxSet& idx = this->solver()->fVec().idx();
   const R*   ub  = this->solver()->ubBound().get_const_ptr();
   const R*   lb  = this->solver()->lbBound().get_const_ptr();

   R epsilon = this->solver()->epsilon();
   int  leave   = -1;

   R x;
   int  i;
   int  j;

   // PARALLEL the j loop could be parallelized
   if(val > 0)
   {
      // Loop over NZEs of delta vector.
      for(j = 0; j < idx.size(); ++j)
      {
         i = idx.index(j);
         x = upd[i];

         if(x > epsilon)
         {
            if(ub[i] < R(infinity))
            {
               R y = (ub[i] - vec[i] + this->delta) / x;

               if(y < val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lb[i] > R(-infinity))
            {
               R y = (lb[i] - vec[i] - this->delta) / x;

               if(y < val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
      }

      if(leave >= 0)
      {
         x   = upd[leave];

         // BH 2005-11-30: It may well happen that the basis is degenerate and the
         // selected leaving variable is (at most this->delta) beyond its bound. (This
         // happens for instance on LP/netlib/adlittle.mps with setting -r -t0.)
         // In that case we do a pivot step with length zero to avoid difficulties.
         if((x > epsilon  && vec[leave] >= ub[leave]) ||
               (x < -epsilon && vec[leave] <= lb[leave]))
         {
            val = 0.0;
         }
         else
         {
            val = (x > epsilon) ? ub[leave] : lb[leave];
            val = (val - vec[leave]) / x;
         }
      }

      SOPLEX_ASSERT_WARN("WDEFRT01", val > -epsilon);
   }
   else
   {
      for(j = 0; j < idx.size(); ++j)
      {
         i = idx.index(j);
         x = upd[i];

         if(x < -epsilon)
         {
            if(ub[i] < R(infinity))
            {
               R y = (ub[i] - vec[i] + this->delta) / x;

               if(y > val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
         else if(x > epsilon)
         {
            if(lb[i] > R(-infinity))
            {
               R y = (lb[i] - vec[i] - this->delta) / x;

               if(y > val)
               {
                  leave = i;
                  val   = y;
               }
            }
         }
      }

      if(leave >= 0)
      {
         x   = upd[leave];

         // See comment above.
         if((x < -epsilon && vec[leave] >= ub[leave]) ||
               (x > epsilon  && vec[leave] <= lb[leave]))
         {
            val = 0.0;
         }
         else
         {
            val = (x < epsilon) ? ub[leave] : lb[leave];
            val = (val - vec[leave]) / x;
         }
      }

      SOPLEX_ASSERT_WARN("WDEFRT02", val < epsilon);
   }

   return leave;
}